

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O0

void __thiscall
test::syntax_tests::iu_SyntaxTest_x_iutest_x_Null_Test::iu_SyntaxTest_x_iutest_x_Null_Test
          (iu_SyntaxTest_x_iutest_x_Null_Test *this)

{
  iu_SyntaxTest_x_iutest_x_Null_Test *this_local;
  
  iutest::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__iu_SyntaxTest_x_iutest_x_Null_Test_00627820;
  return;
}

Assistant:

IUTEST(SyntaxTest, Null)
{
    int* p = NULL;
    if( int x = 1 )
        IUTEST_ASSERT_NULL(p) << x;
    if( int x = 1 )
        IUTEST_EXPECT_NULL(p) << x;
    if( int x = 1 )
        IUTEST_INFORM_NULL(p) << x;
    if( int x = 1 )
        IUTEST_ASSUME_NULL(p) << x;
}